

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_TestFailure_UnexpectedExceptionFailure_StandardException_TestShell::createTest
          (TEST_TestFailure_UnexpectedExceptionFailure_StandardException_TestShell *this)

{
  TEST_TestFailure_UnexpectedExceptionFailure_StandardException_Test *this_00;
  
  this_00 = (TEST_TestFailure_UnexpectedExceptionFailure_StandardException_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
                         ,0x1b7);
  TEST_TestFailure_UnexpectedExceptionFailure_StandardException_Test::
  TEST_TestFailure_UnexpectedExceptionFailure_StandardException_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestFailure, UnexpectedExceptionFailure_StandardException)
{
    std::runtime_error e("Some error");
    UnexpectedExceptionFailure f(test, e);
#if CPPUTEST_HAVE_RTTI
    STRCMP_CONTAINS("Unexpected exception of type '", f.getMessage().asCharString());
    STRCMP_CONTAINS("runtime_error", f.getMessage().asCharString());
    STRCMP_CONTAINS("' was thrown: Some error", f.getMessage().asCharString());
#else
    FAILURE_EQUAL("Unexpected exception of unknown type was thrown.", f);
#endif
}